

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z2.c
# Opt level: O2

LispPTR N_OP_clfmemb(LispPTR item,LispPTR list)

{
  uint uVar1;
  LispPTR LVar2;
  
  LVar2 = 0xffffffff;
  uVar1 = item & 0xfff0000;
  if ((((uVar1 == 0) || (uVar1 == 0x70000)) || (uVar1 == 0xf0000)) || (uVar1 == 0xe0000)) {
    do {
      if ((*(ushort *)((ulong)(list >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
        if (list != 0) {
          MachineState.tosvalue = list;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        return 0;
      }
      LVar2 = car(list);
      if (LVar2 == item) {
        return list;
      }
      list = cdr(list);
    } while (MachineState.irqend != 0);
    LVar2 = 0xfffffffe;
  }
  MachineState.errorexit = 1;
  MachineState.tosvalue = list;
  return LVar2;
}

Assistant:

LispPTR N_OP_clfmemb(LispPTR item, LispPTR list) { /* OP 35Q */

  switch (item & SEGMASK) {
    case S_POSITIVE: break;
    case S_NEGATIVE: break;
    case S_CHARACTER: break;
    case ATOM_OFFSET: break;
    default: ERROR_EXIT(list);
  }
  /* JRB - Don Charnley claims the code below should be identical to IL:FMEMB,
        so I copied it */

  while (Listp(list)) {
    if (item == car(list)) return list;
    list = cdr(list);
    /* if we get an interrupt, punt so we can handle it safely */
    if (!Irq_Stk_End) {
      TopOfStack = list; /* for continuation */
      TIMER_EXIT(list);
    }
  }
  if (list) ERROR_EXIT(list);
  return list;

}